

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_er_1(m68k_info *info,int opcode,uint8_t size)

{
  uint8_t unaff_retaddr;
  undefined3 in_stack_00000008;
  
  build_er_gen_1(info,opcode._3_1_,_in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

static void build_er_1(m68k_info *info, int opcode, uint8_t size)
{
	build_er_gen_1(info, true, opcode, size);
}